

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * util::lowercase(string *__return_storage_ptr__,string *subject)

{
  pointer pcVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  size_type sVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  pcVar1 = (subject->_M_dataplus)._M_p;
  sVar2 = subject->_M_string_length;
  pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
  for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
    iVar4 = tolower((int)pcVar1[sVar5]);
    pcVar3[sVar5] = (char)iVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string lowercase(const std::string& subject)
{
	std::string result;
	result.resize(subject.length());

	std::transform(subject.begin(), subject.end(), result.begin(), static_cast<int(*)(int)>(std::tolower));

	return result;
}